

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O3

bool __thiscall
draco::GeometryAttribute::ConvertTypedValue<double,unsigned_int>
          (GeometryAttribute *this,AttributeValueIndex att_id,uint8_t out_num_components,
          uint *out_value)

{
  bool bVar1;
  pointer puVar2;
  pointer puVar3;
  undefined8 uVar4;
  uint uVar5;
  byte bVar6;
  ulong uVar7;
  long lVar8;
  double dVar9;
  
  uVar5 = *(uint *)&this->num_components_;
  bVar6 = out_num_components;
  if ((byte)uVar5 < out_num_components) {
    bVar6 = (byte)uVar5;
  }
  if (bVar6 != 0) {
    puVar2 = (this->buffer_->data_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = this->byte_offset_ + (ulong)att_id.value_ * this->byte_stride_;
    puVar3 = (this->buffer_->data_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar1 = this->normalized_;
    lVar8 = 0;
    uVar7 = 0;
    do {
      if (puVar3 <= puVar2 + lVar8 + uVar4) {
        return false;
      }
      dVar9 = *(double *)(puVar2 + uVar7 * 8 + uVar4);
      if ((0x3fe < (uint)((ulong)((long)ABS(dVar9) + -0x10000000000000) >> 0x35) || (long)dVar9 < 0)
          && (ABS(dVar9) != 0.0 && 0xffffffffffffe < (long)dVar9 - 1U)) {
        return false;
      }
      if (4294967295.0 <= dVar9) {
        return false;
      }
      if ((bVar1 & 1U) != 0) {
        if (1.0 < dVar9) {
          return false;
        }
        dVar9 = floor(dVar9 * 4294967295.0 + 0.5);
      }
      out_value[uVar7] = (uint)(long)dVar9;
      uVar7 = uVar7 + 1;
      uVar5 = *(uint *)&this->num_components_;
      bVar6 = (byte)uVar5;
      if (out_num_components <= (byte)uVar5) {
        bVar6 = out_num_components;
      }
      lVar8 = lVar8 + 8;
    } while (uVar7 < bVar6);
  }
  if ((byte)uVar5 < out_num_components) {
    memset(out_value + (uVar5 & 0xff),0,(ulong)((uint)out_num_components + ~(uVar5 & 0xff)) * 4 + 4)
    ;
  }
  return true;
}

Assistant:

bool ConvertTypedValue(AttributeValueIndex att_id, uint8_t out_num_components,
                         OutT *out_value) const {
    const uint8_t *src_address = GetAddress(att_id);

    // Convert all components available in both the original and output formats.
    for (int i = 0; i < std::min(num_components_, out_num_components); ++i) {
      if (!IsAddressValid(src_address)) {
        return false;
      }
      const T in_value = *reinterpret_cast<const T *>(src_address);
      if (!ConvertComponentValue<T, OutT>(in_value, normalized_,
                                          out_value + i)) {
        return false;
      }
      src_address += sizeof(T);
    }
    // Fill empty data for unused output components if needed.
    for (int i = num_components_; i < out_num_components; ++i) {
      out_value[i] = static_cast<OutT>(0);
    }
    return true;
  }